

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

void __thiscall
capnp::InputStreamMessageReader::InputStreamMessageReader
          (InputStreamMessageReader *this,InputStream *inputStream,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  byte **ppbVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  Array<capnp::word> *pAVar3;
  size_t sVar4;
  DirectWireValue<unsigned_int> *pDVar5;
  ssize_t sVar6;
  size_t __nbytes;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  word *pwVar11;
  word *pwVar12;
  ReaderOptions options_00;
  uint segmentCount;
  size_t totalWords;
  InputStreamMessageReader *local_f8;
  Array<capnp::word> *local_f0;
  InputStream *local_e8;
  size_t local_e0;
  WireValue<uint32_t> firstWord [2];
  Fault f;
  Array<capnp::_::DirectWireValue<unsigned_int>_> moreSizes_heap;
  Fault f_1;
  ReaderOptions options_local;
  WireValue<uint32_t> moreSizes_stack [16];
  
  pwVar12 = scratchSpace.ptr;
  __nbytes = options._8_8_;
  uVar9 = options.traversalLimitInWords;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_002774b8;
  this->inputStream = inputStream;
  local_f0 = &this->ownedSpace;
  this->readPos = (byte *)0x0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  (this->ownedSpace).ptr = (word *)0x0;
  (this->ownedSpace).size_ = 0;
  (this->ownedSpace).disposer = (ArrayDisposer *)0x0;
  local_f8 = this;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  kj::InputStream::read(inputStream,(int)firstWord,(void *)0x8,__nbytes);
  uVar10 = 0;
  segmentCount = firstWord[0].value + 1;
  moreSizes_stack._0_8_ = &segmentCount;
  if (segmentCount != 0) {
    uVar10 = (ulong)firstWord[1].value;
  }
  moreSizes_stack[2].value = 0x200;
  pcVar7 = " < ";
  moreSizes_stack._16_8_ = anon_var_dwarf_4797a;
  moreSizes_stack[6].value = 4;
  moreSizes_stack[7].value = 0;
  moreSizes_stack[8].value._0_1_ = segmentCount < 0x200;
  totalWords = uVar10;
  if (!(bool)(undefined1)moreSizes_stack[8].value) {
    pcVar7 = "Message has too many segments.";
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[31]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xb5,FAILED,"segmentCount < 512","_kjCondition,\"Message has too many segments.\"",
               (DebugComparison<unsigned_int_&,_int> *)moreSizes_stack,
               (char (*) [31])"Message has too many segments.");
    segmentCount = 1;
    kj::_::Debug::Fault::~Fault(&f);
    uVar10 = 1;
  }
  uVar8 = (ulong)(segmentCount & 0xfffffffe);
  local_e0 = scratchSpace.size_;
  if ((segmentCount & 0xfffffffe) < 0x11) {
    moreSizes_heap.ptr = (DirectWireValue<unsigned_int> *)0x0;
    moreSizes_heap.size_ = 0;
    moreSizes_heap.disposer = (ArrayDisposer *)0x0;
    pDVar5 = moreSizes_stack;
  }
  else {
    pDVar5 = kj::_::HeapArrayDisposer::allocate<capnp::_::DirectWireValue<unsigned_int>>(uVar8);
    moreSizes_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    moreSizes_heap.ptr = pDVar5;
    moreSizes_heap.size_ = uVar8;
  }
  local_e8 = inputStream;
  if (1 < segmentCount) {
    kj::InputStream::read(inputStream,(int)pDVar5,(void *)(uVar8 * 4),(size_t)pcVar7);
    for (uVar8 = 0; segmentCount - 1 != uVar8; uVar8 = uVar8 + 1) {
      totalWords = totalWords + pDVar5[uVar8].value;
    }
  }
  sVar4 = local_e0;
  f.exception = (Exception *)&totalWords;
  pcVar7 = " <= ";
  if (uVar9 < totalWords) {
    pcVar7 = 
    "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions.";
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[93]>
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xc9,FAILED,"totalWords <= options.traversalLimitInWords",
               "_kjCondition,\"Message is too large.  To increase the limit on the receiving end, see \" \"capnp::ReaderOptions.\""
               ,(DebugComparison<unsigned_long_&,_unsigned_long_&> *)&f,
               (char (*) [93])
               "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions."
              );
    segmentCount = 1;
    if (uVar9 < uVar10) {
      uVar10 = uVar9;
    }
    totalWords = uVar10;
    kj::_::Debug::Fault::~Fault(&f_1);
  }
  if (sVar4 < totalWords) {
    f.exception = (Exception *)kj::_::HeapArrayDisposer::allocate<capnp::word>(totalWords);
    pAVar3 = local_f0;
    kj::Array<capnp::word>::operator=(local_f0,(Array<capnp::word> *)&f);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)&f);
    pwVar12 = pAVar3->ptr;
  }
  uVar10 = uVar10 & 0xffffffff;
  (local_f8->segment0).ptr = pwVar12;
  (local_f8->segment0).size_ = uVar10;
  if (1 < segmentCount) {
    f.exception = (Exception *)
                  kj::_::HeapArrayDisposer::allocate<kj::ArrayPtr<capnp::word_const>>
                            ((ulong)(segmentCount - 1));
    kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
              (&this->moreSegments,(Array<kj::ArrayPtr<const_capnp::word>_> *)&f);
    kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array
              ((Array<kj::ArrayPtr<const_capnp::word>_> *)&f);
    uVar9 = uVar10;
    for (pcVar7 = (char *)0x0; (char *)((ulong)(segmentCount - 1) << 2) != pcVar7;
        pcVar7 = pcVar7 + 4) {
      uVar8 = (ulong)*(uint *)((long)&pDVar5->value + (long)pcVar7);
      pwVar11 = pwVar12 + uVar9;
      uVar9 = uVar9 + uVar8;
      pAVar2 = (this->moreSegments).ptr;
      *(word **)((long)&pAVar2->ptr + (long)pcVar7 * 4) = pwVar11;
      *(ulong *)((long)&pAVar2->size_ + (long)pcVar7 * 4) = uVar8;
    }
  }
  if (segmentCount != 0) {
    if (segmentCount == 1) {
      kj::InputStream::read(local_e8,(int)pwVar12,(void *)(totalWords << 3),(size_t)pcVar7);
    }
    else {
      ppbVar1 = &local_f8->readPos;
      *ppbVar1 = (byte *)pwVar12;
      sVar6 = kj::InputStream::read(local_e8,(int)pwVar12,(void *)(totalWords << 3),uVar10 << 3);
      *ppbVar1 = *ppbVar1 + sVar6;
    }
  }
  kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array(&moreSizes_heap);
  return;
}

Assistant:

InputStreamMessageReader::InputStreamMessageReader(
    kj::InputStream& inputStream, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : MessageReader(options), inputStream(inputStream), readPos(nullptr) {
  _::WireValue<uint32_t> firstWord[2];

  inputStream.read(kj::arrayPtr(firstWord).asBytes());

  uint segmentCount = firstWord[0].get() + 1;
  uint segment0Size = segmentCount == 0 ? 0 : firstWord[1].get();

  size_t totalWords = segment0Size;

  // Reject messages with too many segments for security reasons.
  KJ_REQUIRE(segmentCount < 512, "Message has too many segments.") {
    segmentCount = 1;
    segment0Size = 1;
    break;
  }

  // Read sizes for all segments except the first.  Include padding if necessary.
  KJ_STACK_ARRAY(_::WireValue<uint32_t>, moreSizes, segmentCount & ~1, 16, 64);
  if (segmentCount > 1) {
    inputStream.read(moreSizes.asBytes());
    for (uint i = 0; i < segmentCount - 1; i++) {
      totalWords += moreSizes[i].get();
    }
  }

  // Don't accept a message which the receiver couldn't possibly traverse without hitting the
  // traversal limit.  Without this check, a malicious client could transmit a very large segment
  // size to make the receiver allocate excessive space and possibly crash.
  KJ_REQUIRE(totalWords <= options.traversalLimitInWords,
             "Message is too large.  To increase the limit on the receiving end, see "
             "capnp::ReaderOptions.") {
    segmentCount = 1;
    segment0Size = kj::min(segment0Size, options.traversalLimitInWords);
    totalWords = segment0Size;
    break;
  }

  if (scratchSpace.size() < totalWords) {
    // TODO(perf):  Consider allocating each segment as a separate chunk to reduce memory
    //   fragmentation.
    ownedSpace = kj::heapArray<word>(totalWords);
    scratchSpace = ownedSpace;
  }

  segment0 = scratchSpace.first(segment0Size);

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);
    size_t offset = segment0Size;

    for (uint i = 0; i < segmentCount - 1; i++) {
      uint segmentSize = moreSizes[i].get();
      moreSegments[i] = scratchSpace.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  if (segmentCount == 1) {
    inputStream.read(scratchSpace.first(totalWords).asBytes());
  } else if (segmentCount > 1) {
    readPos = scratchSpace.asBytes().begin();
    readPos += inputStream.read(kj::arrayPtr(readPos, totalWords * sizeof(word)), segment0Size * sizeof(word));
  }
}